

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::ScanLineInputFile::readPixels(ScanLineInputFile *this,int scanLine1,int scanLine2)

{
  int iVar1;
  LineOrder LVar2;
  int iVar3;
  Data *pDVar4;
  InputStreamMutex *streamData;
  OptimizationMode OVar5;
  pointer ppLVar6;
  LineBuffer *pLVar7;
  pointer ppLVar8;
  int iVar9;
  Task *this_00;
  undefined **ppuVar10;
  ArgExc *pAVar11;
  IoExc *this_01;
  int minY;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  string *psVar16;
  int iVar17;
  string *psVar18;
  TaskGroup taskGroup;
  stringstream _iex_replace_s;
  
  __iex_replace_s = this->_streamData;
  std::mutex::lock(&__iex_replace_s->super_Mutex);
  pDVar4 = this->_data;
  if ((pDVar4->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar4->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar11,"No frame buffer specified as pixel data destination.");
    __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  iVar15 = scanLine2;
  if (scanLine2 < scanLine1) {
    iVar15 = scanLine1;
    scanLine1 = scanLine2;
  }
  iVar1 = pDVar4->minY;
  if ((iVar1 <= scanLine1) && (iVar15 <= pDVar4->maxY)) {
    LVar2 = pDVar4->lineOrder;
    iVar3 = pDVar4->linesInBuffer;
    IlmThread_2_5::TaskGroup::TaskGroup(&taskGroup);
    iVar13 = iVar15;
    iVar9 = scanLine1;
    if (LVar2 == INCREASING_Y) {
      iVar13 = scanLine1;
      iVar9 = iVar15;
    }
    for (uVar14 = (ulong)((iVar13 - iVar1) / iVar3);
        (long)(int)((iVar9 - iVar1) / iVar3 + (uint)(LVar2 == INCREASING_Y) * 2 + -1) != uVar14;
        uVar14 = uVar14 + (-(ulong)(LVar2 != INCREASING_Y) | 1)) {
      pDVar4 = this->_data;
      streamData = this->_streamData;
      OVar5 = pDVar4->optimizationMode;
      ppLVar6 = (pDVar4->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pLVar7 = ppLVar6[uVar14 % (ulong)((long)(pDVar4->lineBuffers).
                                              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppLVar6 >> 3)];
      IlmThread_2_5::Semaphore::wait();
      iVar13 = (int)uVar14;
      if (iVar13 != pLVar7->maxY) {
        iVar17 = pDVar4->linesInBuffer;
        minY = iVar17 * iVar13 + pDVar4->minY;
        *(int *)((long)&pLVar7->dataPtr + 4) = minY;
        pLVar7->dataSize = iVar17 + minY + -1;
        pLVar7->maxY = iVar13;
        (pLVar7->buffer)._size = 0;
        anon_unknown_7::readPixelData
                  (streamData,pDVar4,minY,&(pLVar7->buffer)._data,(int *)&pLVar7->dataPtr);
      }
      iVar13 = *(int *)((long)&pLVar7->dataPtr + 4);
      iVar17 = pLVar7->dataSize;
      this_00 = (Task *)operator_new(0x30);
      if (((ulong)OVar5 & 1) == 0) {
        IlmThread_2_5::Task::Task(this_00,&taskGroup);
        ppuVar10 = &PTR__LineBufferTask_03144e28;
      }
      else {
        IlmThread_2_5::Task::Task(this_00,&taskGroup);
        ppuVar10 = &PTR__LineBufferTaskIIF_03144de8;
      }
      if (iVar15 <= iVar17) {
        iVar17 = iVar15;
      }
      if (iVar13 <= scanLine1) {
        iVar13 = scanLine1;
      }
      *(undefined ***)this_00 = ppuVar10;
      *(Data **)(this_00 + 0x10) = pDVar4;
      *(LineBuffer **)(this_00 + 0x18) = pLVar7;
      *(int *)(this_00 + 0x20) = iVar13;
      *(int *)(this_00 + 0x24) = iVar17;
      *(OptimizationMode *)(this_00 + 0x28) = OVar5;
      IlmThread_2_5::ThreadPool::addGlobalTask(this_00);
    }
    IlmThread_2_5::TaskGroup::~TaskGroup(&taskGroup);
    ppLVar6 = (this->_data->lineBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppLVar8 = (this->_data->lineBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    psVar18 = (string *)0x0;
    for (lVar12 = 0; (long)ppLVar8 - (long)ppLVar6 >> 3 != lVar12; lVar12 = lVar12 + 1) {
      pLVar7 = ppLVar6[lVar12];
      psVar16 = (string *)&pLVar7->compressor;
      if (psVar18 != (string *)0x0) {
        psVar16 = psVar18;
      }
      if ((char)pLVar7->scanLineMin != '\0') {
        psVar18 = psVar16;
      }
      *(undefined1 *)&pLVar7->scanLineMin = 0;
    }
    if (psVar18 == (string *)0x0) {
      IlmThread_2_5::Lock::~Lock((Lock *)&_iex_replace_s);
      return;
    }
    this_01 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::IoExc::IoExc(this_01,psVar18);
    __cxa_throw(this_01,&Iex_2_5::IoExc::typeinfo,Iex_2_5::IoExc::~IoExc);
  }
  pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar11,"Tried to read scan line outside the image file\'s data window.");
  __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void	
ScanLineInputFile::readPixels (int scanLine1, int scanLine2)
{
    try
    {
        Lock lock (*_streamData);

	if (_data->slices.size() == 0)
	    throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
			       "as pixel data destination.");

	int scanLineMin = min (scanLine1, scanLine2);
	int scanLineMax = max (scanLine1, scanLine2);

	if (scanLineMin < _data->minY || scanLineMax > _data->maxY)
	    throw IEX_NAMESPACE::ArgExc ("Tried to read scan line outside "
			       "the image file's data window.");

        //
        // We impose a numbering scheme on the lineBuffers where the first
        // scanline is contained in lineBuffer 1.
        //
        // Determine the first and last lineBuffer numbers in this scanline
        // range. We always attempt to read the scanlines in the order that
        // they are stored in the file.
        //

        int start, stop, dl;

        if (_data->lineOrder == INCREASING_Y)
        {
            start = (scanLineMin - _data->minY) / _data->linesInBuffer;
            stop  = (scanLineMax - _data->minY) / _data->linesInBuffer + 1;
            dl = 1;
        }
        else
        {
            start = (scanLineMax - _data->minY) / _data->linesInBuffer;
            stop  = (scanLineMin - _data->minY) / _data->linesInBuffer - 1;
            dl = -1;
        }

        //
        // Create a task group for all line buffer tasks.  When the
	// task group goes out of scope, the destructor waits until
	// all tasks are complete.
        //
        
        {
            TaskGroup taskGroup;
    
            //
            // Add the line buffer tasks.
            //
            // The tasks will execute in the order that they are created
            // because we lock the line buffers during construction and the
            // constructors are called by the main thread.  Hence, in order
	    // for a successive task to execute the previous task which
	    // used that line buffer must have completed already.
            //
    
            for (int l = start; l != stop; l += dl)
            {
                ThreadPool::addGlobalTask (newLineBufferTask (&taskGroup,
                                                              _streamData,
                                                              _data, l,
                                                              scanLineMin,
                                                              scanLineMax,
                                                              _data->optimizationMode));
            }
        
	    //
            // finish all tasks
	    //
        }
        
	//
	// Exeption handling:
	//
	// LineBufferTask::execute() may have encountered exceptions, but
	// those exceptions occurred in another thread, not in the thread
	// that is executing this call to ScanLineInputFile::readPixels().
	// LineBufferTask::execute() has caught all exceptions and stored
	// the exceptions' what() strings in the line buffers.
	// Now we check if any line buffer contains a stored exception; if
	// this is the case then we re-throw the exception in this thread.
	// (It is possible that multiple line buffers contain stored
	// exceptions.  We re-throw the first exception we find and
	// ignore all others.)
	//

	const string *exception = 0;

        for (size_t i = 0; i < _data->lineBuffers.size(); ++i)
	{
            LineBuffer *lineBuffer = _data->lineBuffers[i];

	    if (lineBuffer->hasException && !exception)
		exception = &lineBuffer->exception;

	    lineBuffer->hasException = false;
	}

	if (exception)
	    throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Error reading pixel data from image "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}